

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-filenames.c
# Opt level: O1

void CGTFS_Filenames(void)

{
  int iVar1;
  char *filepath;
  char *local_28;
  char *local_20;
  
  iVar1 = greatest_test_pre("filenames_no_trailing_slash");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      make_filepath(&local_28,"/some/folder","some.file");
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = greatest_do_assert_equal_t
                        ("/some/folder/some.file",local_28,&greatest_type_info_string,(void *)0x0);
      if (iVar1 == 0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-filenames.c"
        ;
        greatest_info.fail_line = 0x18;
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
          greatest_info.msg = "type_info->equal callback missing!";
        }
        else {
          greatest_info.msg = "expected != filepath";
        }
        iVar1 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011db28;
      }
      else {
        if (local_28 != (char *)0x0) {
          free(local_28);
        }
        greatest_info.msg = (char *)0x0;
        iVar1 = 0;
      }
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("filenames_with_trailing_slash");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      make_filepath(&local_28,"/some/folder/","some.file");
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = greatest_do_assert_equal_t
                        ("/some/folder/some.file",local_28,&greatest_type_info_string,(void *)0x0);
      if (iVar1 == 0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-filenames.c"
        ;
        greatest_info.fail_line = 0x21;
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
          greatest_info.msg = "type_info->equal callback missing!";
        }
        else {
          greatest_info.msg = "expected != filepath";
        }
        iVar1 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011db28;
      }
      else {
        if (local_28 != (char *)0x0) {
          free(local_28);
        }
        greatest_info.msg = (char *)0x0;
        iVar1 = 0;
      }
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("filenames_passed_null");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    make_filepath(&local_28,(char *)0x0,"");
    make_filepath(&local_20,"",(char *)0x0);
    if (local_28 == (char *)0x0) {
      greatest_info.assertions = greatest_info.assertions + 2;
      if (local_20 == (char *)0x0) {
        greatest_info.msg = (char *)0x0;
        iVar1 = 0;
        goto LAB_0011db0a;
      }
      greatest_info.fail_line = 0x2f;
      greatest_info.msg = "filepath2";
    }
    else {
      greatest_info.fail_line = 0x2e;
      greatest_info.msg = "filepath";
      greatest_info.assertions = greatest_info.assertions + 1;
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-filenames.c"
    ;
    iVar1 = -1;
    if ((greatest_info.flags & 4) != 0) {
LAB_0011db28:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-filenames.c"
      ;
      abort();
    }
  }
LAB_0011db0a:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_Filenames) {
    RUN_TEST(filenames_no_trailing_slash);
    RUN_TEST(filenames_with_trailing_slash);
    RUN_TEST(filenames_passed_null);
}